

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O3

void __thiscall
TPZDohrSubstruct<float>::ContributeTestV1
          (TPZDohrSubstruct<float> *this,TPZFMatrix<float> *testV1,int NumCoarse)

{
  int iVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  TPZFMatrix<float> temp1;
  TPZFMatrix<float> local_1e0;
  TPZFMatrix<float> local_150;
  TPZFMatrix<float> local_c0;
  
  iVar1 = this->fNEquations;
  lVar2 = (this->fCoarseIndex).fNElements;
  local_150.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_150.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_150.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181dbe8;
  local_150.fElem = (float *)0x0;
  local_150.fGiven = (float *)0x0;
  local_150.fSize = 0;
  local_150.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = (long)iVar1;
  local_150.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = lVar2;
  TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
  local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
  local_150.fPivot.super_TPZVec<int>.fNElements = 0;
  local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_150.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813d70;
  local_150.fWork.fStore = (float *)0x0;
  local_150.fWork.fNElements = 0;
  local_150.fWork.fNAlloc = 0;
  uVar5 = lVar2 * iVar1;
  if (uVar5 != 0) {
    uVar4 = 0xffffffffffffffff;
    if (uVar5 < 0x4000000000000000) {
      uVar4 = uVar5 * 4;
    }
    local_150.fElem = (float *)operator_new__(uVar4);
  }
  lVar2 = (this->fPhiC).super_TPZMatrix<float>.super_TPZBaseMatrix.fRow;
  if (0 < lVar2) {
    lVar6 = (this->fPhiC).super_TPZMatrix<float>.super_TPZBaseMatrix.fCol;
    lVar3 = 0;
    do {
      if (0 < lVar6) {
        lVar2 = 0;
        do {
          lVar6 = (this->fPhiC).super_TPZMatrix<float>.super_TPZBaseMatrix.fRow;
          if (lVar6 <= lVar3) {
            TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((local_150.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow <= lVar3) ||
             (local_150.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol <= lVar2)) {
            TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_150.fElem[local_150.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow * lVar2 + lVar3]
               = (this->fPhiC).fElem[lVar6 * lVar2 + lVar3] *
                 (this->fWeights).super_TPZVec<float>.fStore[lVar3];
          lVar2 = lVar2 + 1;
          lVar6 = (this->fPhiC).super_TPZMatrix<float>.super_TPZBaseMatrix.fCol;
        } while (lVar2 < lVar6);
        lVar2 = (this->fPhiC).super_TPZMatrix<float>.super_TPZBaseMatrix.fRow;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < lVar2);
  }
  iVar1 = this->fNEquations;
  local_1e0.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 1;
  local_1e0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1e0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1e0.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181dbe8;
  local_1e0.fElem = (float *)0x0;
  local_1e0.fGiven = (float *)0x0;
  local_1e0.fSize = 0;
  local_1e0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = (long)iVar1;
  TPZVec<int>::TPZVec(&local_1e0.fPivot.super_TPZVec<int>,0);
  local_1e0.fPivot.super_TPZVec<int>.fStore = local_1e0.fPivot.fExtAlloc;
  local_1e0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_1e0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1e0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1e0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813d70;
  local_1e0.fWork.fStore = (float *)0x0;
  local_1e0.fWork.fNElements = 0;
  local_1e0.fWork.fNAlloc = 0;
  if (iVar1 != 0) {
    uVar5 = 0xffffffffffffffff;
    if (-1 < iVar1) {
      uVar5 = (long)iVar1 << 2;
    }
    local_1e0.fElem = (float *)operator_new__(uVar5);
  }
  iVar1 = this->fNEquations;
  lVar2 = (long)NumCoarse;
  local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181dbe8;
  local_c0.fElem = (float *)0x0;
  local_c0.fGiven = (float *)0x0;
  local_c0.fSize = 0;
  local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = (long)iVar1;
  local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = lVar2;
  TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
  local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
  local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813d70;
  local_c0.fWork.fStore = (float *)0x0;
  local_c0.fWork.fNElements = 0;
  local_c0.fWork.fNAlloc = 0;
  uVar5 = iVar1 * lVar2;
  if (uVar5 != 0) {
    uVar4 = 0xffffffffffffffff;
    if (uVar5 < 0x4000000000000000) {
      uVar4 = uVar5 * 4;
    }
    local_c0.fElem = (float *)operator_new__(uVar4);
    if (0 < (long)uVar5) {
      memset(local_c0.fElem,0,uVar5 * 4);
    }
  }
  if (0 < (this->fCoarseIndex).fNElements) {
    lVar6 = 0;
    do {
      TPZMatrix<float>::GetSub
                (&local_150.super_TPZMatrix<float>,0,lVar6,
                 local_150.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow,1,&local_1e0);
      TPZMatrix<float>::PutSub
                (&local_c0.super_TPZMatrix<float>,0,(long)(this->fCoarseIndex).fStore[lVar6],
                 &local_1e0);
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->fCoarseIndex).fNElements);
  }
  TPZFMatrix<float>::Resize(&local_1e0,1,lVar2);
  if (0 < this->fNEquations) {
    lVar2 = 0;
    do {
      TPZMatrix<float>::GetSub
                (&local_c0.super_TPZMatrix<float>,lVar2,0,1,
                 local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol,&local_1e0);
      if (0 < NumCoarse) {
        uVar5 = 0;
        do {
          if ((local_1e0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow < 1) ||
             (local_1e0.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol <= (long)uVar5)) {
            TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar6 = (long)(this->fGlobalIndex).fStore[lVar2];
          if ((lVar6 < 0) ||
             ((lVar3 = (testV1->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow, lVar3 <= lVar6 ||
              ((testV1->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol <= (long)uVar5)))) {
            TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar3 = lVar3 * uVar5;
          testV1->fElem[lVar3 + lVar6] =
               local_1e0.fElem[local_1e0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow * uVar5] +
               testV1->fElem[lVar3 + lVar6];
          uVar5 = uVar5 + 1;
        } while ((uint)NumCoarse != uVar5);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < this->fNEquations);
  }
  TPZFMatrix<float>::~TPZFMatrix(&local_c0);
  TPZFMatrix<float>::~TPZFMatrix(&local_1e0);
  TPZFMatrix<float>::~TPZFMatrix(&local_150);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::ContributeTestV1(TPZFMatrix<TVar> &testV1, int NumCoarse) {
	/* temp1 will be equal to W(i)*Phi(i) */
	TPZFMatrix<TVar> temp1(fNEquations,fCoarseIndex.NElements());
	int i,j;
	for(i=0;i<fPhiC.Rows();i++) {
		for(j=0;j<fPhiC.Cols();j++) {
			temp1(i,j) = fPhiC(i,j)*fWeights[i];
		}
	}
	/* And now temp2 will be equal to temp1*R(ci) */
	TPZFMatrix<TVar> col(fNEquations,1);
	TPZFMatrix<TVar> temp2(fNEquations,NumCoarse,0.);
	for(i=0;i<fCoarseIndex.NElements();i++) {
		temp1.GetSub(0,i,temp1.Rows(),1,col);
		temp2.PutSub(0,fCoarseIndex[i],col);
	}
	/* And testV1 will be equal to R(i)_trans*temp2 */
	col.Resize(1,NumCoarse);
	for(i=0;i<fNEquations;i++) {
		temp2.GetSub(i,0,1,temp2.Cols(),col);
		//testV1.PutSub(fGlobalIndex[i],0,col);
		for(j=0;j<NumCoarse;j++) {
			testV1(fGlobalIndex[i],j) += col(0,j);
		}
	}
}